

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_manager.cpp
# Opt level: O0

void __thiscall CfdCoreManager_Destructor_Test::TestBody(CfdCoreManager_Destructor_Test *this)

{
  bool bVar1;
  CfdCoreManager *this_00;
  char *message;
  AssertHelper local_58;
  Message local_50;
  uint64_t local_48;
  unsigned_long local_40;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  CfdCoreManager *object;
  CfdCoreManager_Destructor_Test *this_local;
  
  this_00 = (CfdCoreManager *)operator_new(0x50);
  cfd::core::CfdCoreManager::CfdCoreManager(this_00);
  local_40 = cfd::core::CfdCoreManager::GetSupportedFunction();
  local_48 = GetSupportedFunctionExpect();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_38,"object->GetSupportedFunction()",
             "GetSupportedFunctionExpect()",&local_40,&local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_manager.cpp"
               ,0x40,message);
    testing::internal::AssertHelper::operator=(&local_58,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (this_00 != (CfdCoreManager *)0x0) {
    (**(code **)(*(long *)this_00 + 8))();
  }
  return;
}

Assistant:

TEST(CfdCoreManager, Destructor) {
  CfdCoreManager* object = new CfdCoreManager();
  EXPECT_EQ(object->GetSupportedFunction(), GetSupportedFunctionExpect());
  delete object;
}